

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O1

ptr<Value> __thiscall Function::call(Function *this,ValueList *arguments)

{
  Object *this_00;
  pointer psVar1;
  element_type *peVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Environment *other;
  long lVar7;
  undefined4 *puVar8;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar9;
  ulong uVar10;
  long lVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ptr<Value> pVar12;
  Environment localEnv;
  ptr<Value> local_a0;
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_90;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_00 = (Object *)
            arguments[2].
            super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (this_00 == (Object *)0x0) {
    puVar8 = (undefined4 *)__cxa_allocate_exception(0x10);
    local_90._M_buckets = &local_90._M_before_begin._M_nxt;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Function owner not set","")
    ;
    ExceptionObjects::null_value((ExceptionObjects *)&local_48,(string *)&local_90);
    uVar3 = (undefined4)local_48;
    uVar4 = local_48._4_4_;
    uVar5 = (undefined4)uStack_40;
    uVar6 = uStack_40._4_4_;
    local_48 = 0;
    uStack_40 = 0;
    *puVar8 = uVar3;
    puVar8[1] = uVar4;
    puVar8[2] = uVar5;
    puVar8[3] = uVar6;
    __cxa_throw(puVar8,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
  }
  psVar1 = (arguments->
           super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (in_RDX[1] - *in_RDX >> 4 ==
      (long)(psVar1->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi -
      (long)(psVar1->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr >> 5) {
    other = Object::getEnvironment(this_00);
    Environment::Environment((Environment *)&local_90,other);
    lVar7 = *in_RDX;
    if (in_RDX[1] != lVar7) {
      lVar9 = 4;
      lVar11 = 0;
      uVar10 = 0;
      do {
        peVar2 = (((arguments->
                   super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>
                   )._M_impl.super__Vector_impl_data._M_end_of_storage)->
                 super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_a0.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)(lVar7 + -8 + lVar9 * 2);
        local_a0.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar7 + lVar9 * 2);
        if (local_a0.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_a0.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_a0.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_a0.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_a0.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        Environment::putValue
                  ((Environment *)&local_90,
                   (Identifier *)((long)&(peVar2->super_Member)._vptr_Member + lVar11),Public,
                   &local_a0,false);
        if (local_a0.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        uVar10 = uVar10 + 1;
        lVar7 = *in_RDX;
        lVar9 = lVar9 + 8;
        lVar11 = lVar11 + 0x20;
      } while (uVar10 < (ulong)(in_RDX[1] - lVar7 >> 4));
    }
    psVar1 = arguments[1].
             super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    (*(code *)(((psVar1->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Member)._vptr_Member)(psVar1,&local_90);
    (this->super_Value).super_Member._vptr_Member = (_func_int **)0x0;
    (this->super_Callable)._vptr_Callable = (_func_int **)0x0;
    std::
    _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_90);
    pVar12.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    pVar12.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Value;
    return (ptr<Value>)pVar12.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
  }
  puVar8 = (undefined4 *)__cxa_allocate_exception(0x10);
  local_90._M_buckets = &local_90._M_before_begin._M_nxt;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Invalid number of arguments","");
  ExceptionObjects::call_failed((ExceptionObjects *)&local_58,(string *)&local_90);
  uVar3 = (undefined4)local_58;
  uVar4 = local_58._4_4_;
  uVar5 = (undefined4)uStack_50;
  uVar6 = uStack_50._4_4_;
  local_58 = 0;
  uStack_50 = 0;
  *puVar8 = uVar3;
  puVar8[1] = uVar4;
  puVar8[2] = uVar5;
  puVar8[3] = uVar6;
  __cxa_throw(puVar8,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

ptr<Value> call(ValueList& arguments) override {
        if(!owner)
            throw ThrowPacket(ExceptionObjects::null_value("Function owner not set"));

        if(arguments.size() != parameters -> size())
            throw ThrowPacket(ExceptionObjects::call_failed("Invalid number of arguments"));

        Environment localEnv = *(owner -> getEnvironment());

        for(int i = 0; i < arguments.size(); i++)
            localEnv.putValue((*parameters)[i], Scope::Public, arguments[i], false);

        try {
            statementBlock -> execute(&localEnv);
        } catch(ptr<Value> value) {
            return value;
        }

        return nullptr;
    }